

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_cwksp.h
# Opt level: O2

void ZSTD_cwksp_init(ZSTD_cwksp *ws,void *start,size_t size,ZSTD_cwksp_static_alloc_e isStatic)

{
  ws->workspace = start;
  ws->workspaceEnd = (void *)(size + (long)start);
  ws->objectEnd = start;
  ws->tableValidEnd = start;
  ws->phase = ZSTD_cwksp_alloc_objects;
  ws->isStatic = isStatic;
  ZSTD_cwksp_clear(ws);
  ws->workspaceOversizedDuration = 0;
  return;
}

Assistant:

MEM_STATIC void ZSTD_cwksp_init(ZSTD_cwksp* ws, void* start, size_t size, ZSTD_cwksp_static_alloc_e isStatic) {
    DEBUGLOG(4, "cwksp: init'ing workspace with %zd bytes", size);
    assert(((size_t)start & (sizeof(void*)-1)) == 0); /* ensure correct alignment */
    ws->workspace = start;
    ws->workspaceEnd = (BYTE*)start + size;
    ws->objectEnd = ws->workspace;
    ws->tableValidEnd = ws->objectEnd;
    ws->phase = ZSTD_cwksp_alloc_objects;
    ws->isStatic = isStatic;
    ZSTD_cwksp_clear(ws);
    ws->workspaceOversizedDuration = 0;
    ZSTD_cwksp_assert_internal_consistency(ws);
}